

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

void __thiscall
wasm::SimplifyLocals<false,_true,_true>::~SimplifyLocals(SimplifyLocals<false,_true,_true> *this)

{
  pointer ppLVar1;
  pointer ppIVar2;
  pointer ppBVar3;
  pointer ppEVar4;
  pointer puVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  
  (this->
  super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__SimplifyLocals_00d76458;
  ppLVar1 = (this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppLVar1 != (pointer)0x0) {
    operator_delete(ppLVar1,(long)(this->loopsToEnlarge).
                                  super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar1)
    ;
  }
  ppIVar2 = (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (ppIVar2 != (pointer)0x0) {
    operator_delete(ppIVar2,(long)(this->ifsToEnlarge).
                                  super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar2)
    ;
  }
  ppBVar3 = (this->blocksToEnlarge).
            super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppBVar3 != (pointer)0x0) {
    operator_delete(ppBVar3,(long)(this->blocksToEnlarge).
                                  super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppBVar3)
    ;
  }
  ppEVar4 = (this->expressionStack).flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar4 != (pointer)0x0) {
    operator_delete(ppEVar4,(long)(this->expressionStack).flexible.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar4
                   );
  }
  puVar5 = (this->getCounter).num.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->getCounter).num.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  pTVar6 = (this->getCounter).
           super_PostWalker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>.
           super_Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar6 != (pointer)0x0) {
    operator_delete(pTVar6,(long)*(pointer *)
                                  ((long)&(this->getCounter).
                                          super_PostWalker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>
                                          .
                                          super_Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalGetCounter,_wasm::Visitor<wasm::LocalGetCounter,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar6);
  }
  std::
  vector<std::map<unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>_>,_std::allocator<std::map<unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>_>_>_>
  ::~vector(&this->ifStack);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&(this->unoptimizableBlocks)._M_t);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_true,_true>::BlockBreak>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_true,_true>::BlockBreak>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_true,_true>::BlockBreak>_>_>_>_>
  ::~_Rb_tree(&(this->blockBreaks)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>_>
  ::~_Rb_tree(&(this->sinkables)._M_t);
  pTVar7 = (this->
           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>_>
           ).
           super_LinearExecutionWalker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>
           .
           super_PostWalker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>
           .
           super_Walker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar7 != (pointer)0x0) {
    operator_delete(pTVar7,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>_>
                                          ).
                                          super_LinearExecutionWalker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>
                                          .
                                          super_PostWalker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>
                                          .
                                          super_Walker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>::Task>_>
                                  + 0x10) - (long)pTVar7);
  }
  (this->
  super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__Pass_00d722d8;
  pcVar8 = (this->
           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>_>
           ).super_Pass.name._M_dataplus._M_p;
  paVar9 = &(this->
            super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>_>
            ).super_Pass.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar8 != paVar9) {
    operator_delete(pcVar8,paVar9->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }